

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_writeEpilogue(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity)

{
  uint uVar1;
  void *code;
  ulong in_RDX;
  XXH64_state_t *in_RSI;
  int *in_RDI;
  U32 checksum;
  U32 cBlockHeader24;
  size_t err_code;
  size_t fhSize;
  BYTE *op;
  BYTE *ostart;
  U32 in_stack_ffffffffffffffbc;
  void *in_stack_ffffffffffffffc0;
  XXH64_state_t *local_30;
  ulong local_20;
  XXH64_state_t *state_in;
  size_t local_8;
  
  if (*in_RDI == 0) {
    local_8 = 0xffffffffffffffc4;
  }
  else {
    local_30 = in_RSI;
    local_20 = in_RDX;
    state_in = in_RSI;
    if (*in_RDI == 1) {
      code = (void *)ZSTD_writeFrameHeader
                               ((void *)dstCapacity,(size_t)ostart,(ZSTD_CCtx_params *)op,fhSize,
                                err_code._4_4_);
      in_stack_ffffffffffffffc0 = code;
      uVar1 = ERR_isError((size_t)code);
      if (uVar1 != 0) {
        return (size_t)in_stack_ffffffffffffffc0;
      }
      local_20 = in_RDX - (long)code;
      local_30 = (XXH64_state_t *)((long)code + (long)in_RSI);
      *in_RDI = 2;
    }
    if (*in_RDI != 3) {
      in_stack_ffffffffffffffbc = 1;
      if (local_20 < 3) {
        return 0xffffffffffffffba;
      }
      MEM_writeLE24(in_stack_ffffffffffffffc0,1);
      local_30 = (XXH64_state_t *)((long)&local_30->total_len + 3);
      local_20 = local_20 - 3;
    }
    if (in_RDI[0x43] != 0) {
      XXH64_digest(state_in);
      if (local_20 < 4) {
        return 0xffffffffffffffba;
      }
      MEM_writeLE32(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      local_30 = (XXH64_state_t *)((long)&local_30->total_len + 4);
    }
    *in_RDI = 0;
    local_8 = (long)local_30 - (long)in_RSI;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_writeEpilogue(ZSTD_CCtx* cctx, void* dst, size_t dstCapacity)
{
    BYTE* const ostart = (BYTE*)dst;
    BYTE* op = ostart;

    DEBUGLOG(4, "ZSTD_writeEpilogue");
    RETURN_ERROR_IF(cctx->stage == ZSTDcs_created, stage_wrong, "init missing");

    /* special case : empty frame */
    if (cctx->stage == ZSTDcs_init) {
        size_t fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams, 0, 0);
        FORWARD_IF_ERROR(fhSize, "ZSTD_writeFrameHeader failed");
        dstCapacity -= fhSize;
        op += fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (cctx->stage != ZSTDcs_ending) {
        /* write one last empty block, make it the "last" block */
        U32 const cBlockHeader24 = 1 /* last block */ + (((U32)bt_raw)<<1) + 0;
        ZSTD_STATIC_ASSERT(ZSTD_BLOCKHEADERSIZE == 3);
        RETURN_ERROR_IF(dstCapacity<3, dstSize_tooSmall, "no room for epilogue");
        MEM_writeLE24(op, cBlockHeader24);
        op += ZSTD_blockHeaderSize;
        dstCapacity -= ZSTD_blockHeaderSize;
    }

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "ZSTD_writeEpilogue: write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32(op, checksum);
        op += 4;
    }

    cctx->stage = ZSTDcs_created;  /* return to "created but no init" status */
    return op-ostart;
}